

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
::write_decimal<int>
          (basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
           *this,int value)

{
  basic_buffer<char> *pbVar1;
  size_t sVar2;
  byte bVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  char *pcVar9;
  ulong uVar10;
  
  uVar6 = (ulong)(uint)-value;
  if (0 < value) {
    uVar6 = (ulong)(uint)value;
  }
  uVar5 = (uint)uVar6;
  uVar7 = 0x1f;
  if ((uVar5 | 1) != 0) {
    for (; (uVar5 | 1) >> uVar7 == 0; uVar7 = uVar7 - 1) {
    }
  }
  uVar7 = (uVar7 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
  iVar8 = uVar7 - (uVar5 < *(uint *)(internal::basic_data<void>::ZERO_OR_POWERS_OF_10_32 +
                                    (ulong)uVar7 * 4));
  pbVar1 = (this->out_).container;
  sVar2 = pbVar1->size_;
  uVar10 = ((iVar8 - (value >> 0x1f)) + 1) + sVar2;
  if (pbVar1->capacity_ < uVar10) {
    (**pbVar1->_vptr_basic_buffer)(pbVar1,uVar10);
  }
  pcVar9 = pbVar1->ptr_ + sVar2;
  pbVar1->size_ = uVar10;
  if (value < 0) {
    *pcVar9 = '-';
    pcVar9 = pcVar9 + 1;
  }
  pcVar9 = pcVar9 + (iVar8 + 1);
  if (99 < uVar5) {
    do {
      uVar7 = (uint)uVar6;
      uVar5 = (uint)(uVar6 / 100);
      uVar6 = uVar6 / 100;
      *(undefined2 *)(pcVar9 + -2) =
           *(undefined2 *)
            (internal::basic_data<void>::DIGITS + (ulong)(uVar7 + (int)uVar6 * -100) * 2);
      pcVar9 = pcVar9 + -2;
    } while (9999 < uVar7);
  }
  if (uVar5 < 10) {
    bVar3 = (byte)uVar5 | 0x30;
    lVar4 = -1;
  }
  else {
    pcVar9[-1] = internal::basic_data<void>::DIGITS[((ulong)uVar5 * 2 & 0xffffffff) + 1];
    bVar3 = internal::basic_data<void>::DIGITS[(ulong)uVar5 * 2];
    lVar4 = -2;
  }
  pcVar9[lVar4] = bVar3;
  return;
}

Assistant:

void write_decimal(Int value) {
    typedef typename internal::int_traits<Int>::main_type main_type;
    main_type abs_value = static_cast<main_type>(value);
    bool is_negative = internal::is_negative(value);
    if (is_negative)
      abs_value = 0 - abs_value;
    unsigned num_digits = internal::count_digits(abs_value);
    auto &&it = reserve((is_negative ? 1 : 0) + num_digits);
    if (is_negative)
      *it++ = '-';
    it = internal::format_decimal(it, abs_value, num_digits);
  }